

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O1

mraa_uart_context mraa_uart_init(int index)

{
  _func_mraa_result_t_int *p_Var1;
  _func_mraa_result_t_mraa_uart_context *p_Var2;
  mraa_pin_t meta;
  mraa_pin_t meta_00;
  mraa_boolean_t mVar3;
  mraa_result_t mVar4;
  mraa_uart_context __ptr;
  long lVar5;
  long lVar6;
  char *__fmt;
  mraa_pin_t *pmVar7;
  int *piVar8;
  int __pri;
  undefined8 *puVar9;
  byte bVar10;
  undefined8 auStackY_f8 [7];
  undefined1 in_stack_ffffffffffffff40 [40];
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 in_stack_ffffffffffffff6c [56];
  undefined4 local_28;
  
  bVar10 = 0;
  if (plat == (mraa_board_t *)0x0) {
    __fmt = "uart%i: init: platform not initialised";
  }
  else {
    mVar3 = mraa_is_sub_platform_id(index);
    if (mVar3 != 0) {
      __fmt = "uart%i: init: Using sub platform is not supported";
      __pri = 5;
      goto LAB_0010f9f0;
    }
    if (((plat->adv_func == (mraa_adv_func_t *)0x0) ||
        (p_Var1 = plat->adv_func->uart_init_pre, p_Var1 == (_func_mraa_result_t_int *)0x0)) ||
       (mVar4 = (*p_Var1)(index), mVar4 == MRAA_SUCCESS)) {
      if (plat->uart_dev_count == 0) {
        __fmt = "uart%i: init: platform has no UARTs defined";
      }
      else {
        if (plat->uart_dev_count <= index) {
          syslog(3,"uart%i: init: platform has only %i uarts",index);
          return (mraa_uart_context)0x0;
        }
        if (plat->no_bus_mux != 0) goto LAB_0010fa58;
        lVar5 = (long)plat->uart_dev[index].rx;
        if (-1 < lVar5) {
          if (plat->pins[lVar5].uart.mux_total != 0) {
            pmVar7 = &plat->pins[lVar5].uart;
            piVar8 = (int *)&stack0xffffffffffffff78;
            for (lVar6 = 0x19; lVar6 != 0; lVar6 = lVar6 + -1) {
              *piVar8 = pmVar7->pinmap;
              pmVar7 = (mraa_pin_t *)((long)pmVar7 + (ulong)bVar10 * -8 + 4);
              piVar8 = piVar8 + (ulong)bVar10 * -2 + 1;
            }
            piVar8 = (int *)&stack0xffffffffffffff78;
            puVar9 = auStackY_f8;
            for (lVar5 = 0xc; lVar5 != 0; lVar5 = lVar5 + -1) {
              *puVar9 = *(undefined8 *)piVar8;
              piVar8 = piVar8 + ((ulong)bVar10 * -2 + 1) * 2;
              puVar9 = puVar9 + (ulong)bVar10 * -2 + 1;
            }
            meta.mux[2].pin = local_28;
            auVar11 = in_stack_ffffffffffffff40._12_12_;
            auVar12 = in_stack_ffffffffffffff40._24_12_;
            meta.pinmap = in_stack_ffffffffffffff40._0_4_;
            meta.parent_id = in_stack_ffffffffffffff40._4_4_;
            meta.mux_total = in_stack_ffffffffffffff40._8_4_;
            meta.mux[0].pincmd = auVar11._0_4_;
            meta.mux[0].pin = auVar11._4_4_;
            meta.mux[0].value = auVar11._8_4_;
            meta.mux[1].pincmd = auVar12._0_4_;
            meta.mux[1].pin = auVar12._4_4_;
            meta.mux[1].value = auVar12._8_4_;
            meta.mux[2].pincmd = in_stack_ffffffffffffff40._36_4_;
            auVar11 = in_stack_ffffffffffffff6c._4_12_;
            auVar12 = in_stack_ffffffffffffff6c._16_12_;
            auVar13 = in_stack_ffffffffffffff6c._28_12_;
            meta.mux[2].value = in_stack_ffffffffffffff6c._0_4_;
            meta.mux[3].pincmd = auVar11._0_4_;
            meta.mux[3].pin = auVar11._4_4_;
            meta.mux[3].value = auVar11._8_4_;
            meta.mux[4].pincmd = auVar12._0_4_;
            meta.mux[4].pin = auVar12._4_4_;
            meta.mux[4].value = auVar12._8_4_;
            meta.mux[5].pincmd = auVar13._0_4_;
            meta.mux[5].pin = auVar13._4_4_;
            meta.mux[5].value = auVar13._8_4_;
            meta.output_enable = in_stack_ffffffffffffff6c._40_4_;
            meta.complex_cap = (mraa_pin_cap_complex_t)in_stack_ffffffffffffff6c._44_4_;
            meta.gpio_chip = in_stack_ffffffffffffff6c._48_4_;
            meta.gpio_line = in_stack_ffffffffffffff6c._52_4_;
            mVar4 = mraa_setup_mux_mapped(meta);
            if (mVar4 != MRAA_SUCCESS) {
              __fmt = "uart%i: init: failed to setup muxes for RX pin";
              goto LAB_0010f9e8;
            }
          }
        }
        lVar5 = (long)plat->uart_dev[index].tx;
        if (lVar5 < 0) {
LAB_0010fa58:
          __ptr = mraa_uart_init_raw(plat->uart_dev[index].device_path);
          if (__ptr != (mraa_uart_context)0x0) {
            __ptr->index = index;
            if (__ptr->advance_func == (mraa_adv_func_t *)0x0) {
              return __ptr;
            }
            p_Var2 = __ptr->advance_func->uart_init_post;
            if (p_Var2 == (_func_mraa_result_t_mraa_uart_context *)0x0) {
              return __ptr;
            }
            mVar4 = (*p_Var2)(__ptr);
            if (mVar4 == MRAA_SUCCESS) {
              return __ptr;
            }
            free(__ptr);
          }
          return (mraa_uart_context)0x0;
        }
        if (plat->pins[lVar5].uart.mux_total == 0) goto LAB_0010fa58;
        pmVar7 = &plat->pins[lVar5].uart;
        piVar8 = (int *)&stack0xffffffffffffff78;
        for (lVar6 = 0x19; lVar6 != 0; lVar6 = lVar6 + -1) {
          *piVar8 = pmVar7->pinmap;
          pmVar7 = (mraa_pin_t *)((long)pmVar7 + (ulong)bVar10 * -8 + 4);
          piVar8 = piVar8 + (ulong)bVar10 * -2 + 1;
        }
        piVar8 = (int *)&stack0xffffffffffffff78;
        puVar9 = auStackY_f8;
        for (lVar5 = 0xc; lVar5 != 0; lVar5 = lVar5 + -1) {
          *puVar9 = *(undefined8 *)piVar8;
          piVar8 = piVar8 + ((ulong)bVar10 * -2 + 1) * 2;
          puVar9 = puVar9 + (ulong)bVar10 * -2 + 1;
        }
        meta_00.mux[2].pin = local_28;
        auVar11 = in_stack_ffffffffffffff40._12_12_;
        auVar12 = in_stack_ffffffffffffff40._24_12_;
        meta_00.pinmap = in_stack_ffffffffffffff40._0_4_;
        meta_00.parent_id = in_stack_ffffffffffffff40._4_4_;
        meta_00.mux_total = in_stack_ffffffffffffff40._8_4_;
        meta_00.mux[0].pincmd = auVar11._0_4_;
        meta_00.mux[0].pin = auVar11._4_4_;
        meta_00.mux[0].value = auVar11._8_4_;
        meta_00.mux[1].pincmd = auVar12._0_4_;
        meta_00.mux[1].pin = auVar12._4_4_;
        meta_00.mux[1].value = auVar12._8_4_;
        meta_00.mux[2].pincmd = in_stack_ffffffffffffff40._36_4_;
        auVar11 = in_stack_ffffffffffffff6c._4_12_;
        auVar12 = in_stack_ffffffffffffff6c._16_12_;
        auVar13 = in_stack_ffffffffffffff6c._28_12_;
        meta_00.mux[2].value = in_stack_ffffffffffffff6c._0_4_;
        meta_00.mux[3].pincmd = auVar11._0_4_;
        meta_00.mux[3].pin = auVar11._4_4_;
        meta_00.mux[3].value = auVar11._8_4_;
        meta_00.mux[4].pincmd = auVar12._0_4_;
        meta_00.mux[4].pin = auVar12._4_4_;
        meta_00.mux[4].value = auVar12._8_4_;
        meta_00.mux[5].pincmd = auVar13._0_4_;
        meta_00.mux[5].pin = auVar13._4_4_;
        meta_00.mux[5].value = auVar13._8_4_;
        meta_00.output_enable = in_stack_ffffffffffffff6c._40_4_;
        meta_00.complex_cap = (mraa_pin_cap_complex_t)in_stack_ffffffffffffff6c._44_4_;
        meta_00.gpio_chip = in_stack_ffffffffffffff6c._48_4_;
        meta_00.gpio_line = in_stack_ffffffffffffff6c._52_4_;
        mVar4 = mraa_setup_mux_mapped(meta_00);
        if (mVar4 == MRAA_SUCCESS) goto LAB_0010fa58;
        __fmt = "uart%i: init: failed to setup muxes for TX pin";
      }
    }
    else {
      __fmt = "uart%i: init: failure in pre-init platform hook";
    }
  }
LAB_0010f9e8:
  __pri = 3;
LAB_0010f9f0:
  syslog(__pri,__fmt,index);
  return (mraa_uart_context)0x0;
}

Assistant:

mraa_uart_context
mraa_uart_init(int index)
{
    if (plat == NULL) {
        syslog(LOG_ERR, "uart%i: init: platform not initialised", index);
        return NULL;
    }

    if (mraa_is_sub_platform_id(index)) {
        syslog(LOG_NOTICE, "uart%i: init: Using sub platform is not supported", index);
        return NULL;
    }

    if (plat->adv_func != NULL && plat->adv_func->uart_init_pre != NULL) {
        if (plat->adv_func->uart_init_pre(index) != MRAA_SUCCESS) {
            syslog(LOG_ERR, "uart%i: init: failure in pre-init platform hook", index);
            return NULL;
        }
    }

    if (plat->uart_dev_count == 0) {
        syslog(LOG_ERR, "uart%i: init: platform has no UARTs defined", index);
        return NULL;
    }

    if (plat->uart_dev_count <= index) {
        syslog(LOG_ERR, "uart%i: init: platform has only %i uarts", index, plat->uart_dev_count);
        return NULL;
    }

    if (!plat->no_bus_mux) {
        int pos = plat->uart_dev[index].rx;
        if (pos >= 0) {
            if (plat->pins[pos].uart.mux_total > 0) {
                if (mraa_setup_mux_mapped(plat->pins[pos].uart) != MRAA_SUCCESS) {
                    syslog(LOG_ERR, "uart%i: init: failed to setup muxes for RX pin", index);
                    return NULL;
                }
            }
        }

        pos = plat->uart_dev[index].tx;
        if (pos >= 0) {
            if (plat->pins[pos].uart.mux_total > 0) {
                if (mraa_setup_mux_mapped(plat->pins[pos].uart) != MRAA_SUCCESS) {
                    syslog(LOG_ERR, "uart%i: init: failed to setup muxes for TX pin", index);
                    return NULL;
                }
            }
        }
    }

    mraa_uart_context dev = mraa_uart_init_raw((char*)plat->uart_dev[index].device_path);
    if (dev == NULL) {
        return NULL;
    }
    dev->index = index; //Set the board Index.

    if (IS_FUNC_DEFINED(dev, uart_init_post)) {
        mraa_result_t ret = dev->advance_func->uart_init_post(dev);
        if (ret != MRAA_SUCCESS) {
            free(dev);
            return NULL;
        }
    }

    return dev;
}